

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowDistinctSortTree::BuildRun
          (WindowDistinctSortTree *this,idx_t level_nr,idx_t run_idx,
          WindowDistinctAggregatorLocalState *ldastate)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  Vector *pVVar1;
  atomic<unsigned_long> *paVar2;
  DataChunk *this_01;
  SelectionVector *sel_vector;
  Vector *pVVar3;
  Vector *pVVar4;
  DataChunk *chunk;
  WindowDistinctAggregatorGlobalState *pWVar5;
  WindowDistinctAggregatorGlobalState *pWVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  Vector *pVVar10;
  pointer pWVar11;
  FunctionDataWrapper *pFVar12;
  reference this_02;
  reference this_03;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  pointer this_04;
  ulong uVar16;
  ulong uVar17;
  idx_t iVar18;
  WindowDistinctAggregatorGlobalState *pWVar19;
  idx_t iVar20;
  ulong uVar21;
  ulong __n;
  pointer puVar22;
  pointer puVar23;
  AggregateInputData aggr_input_data;
  AggregateInputData local_48;
  
  pWVar5 = this->gdastate;
  this_00 = &(ldastate->super_WindowAggregatorLocalState).cursor;
  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator->(this_00);
  pWVar6 = this->gdastate;
  if ((pWVar5->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.bind_data.ptr = (FunctionData *)0x0;
    pWVar19 = pWVar6;
  }
  else {
    pFVar12 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                        (&(pWVar5->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper);
    local_48.bind_data.ptr =
         (pFVar12->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    pWVar19 = this->gdastate;
  }
  chunk = &pWVar11->chunk;
  this_01 = &ldastate->leaves;
  sel_vector = &ldastate->sel;
  local_48.combine_type = PRESERVE_INPUT;
  pVVar1 = &ldastate->update_v;
  pdVar7 = (ldastate->update_v).data;
  pdVar8 = (ldastate->source_v).data;
  pVVar3 = &ldastate->source_v;
  pVVar4 = &ldastate->target_v;
  pdVar9 = (ldastate->target_v).data;
  local_48.allocator =
       &(pWVar5->super_WindowAggregatorGlobalState).super_WindowAggregatorState.allocator;
  this_02 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::operator[](&(pWVar19->zipped_tree).tree,level_nr);
  this_03 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                          *)this,level_nr);
  iVar18 = (this->
           super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>).
           build_run_length;
  uVar21 = run_idx * iVar18;
  uVar17 = (long)(this_02->first).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_02->first).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar13 = iVar18 + uVar21;
  if (uVar17 < uVar13) {
    uVar13 = uVar17;
  }
  if (uVar21 < uVar13) {
    iVar18 = 0;
    iVar20 = 0;
    __n = uVar21;
    puVar23 = (pointer)0x0;
    do {
      puVar22 = (pWVar6->levels_flat_native).states.
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start +
                (uVar17 * level_nr + __n) * (pWVar6->levels_flat_native).state_size;
      pvVar14 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                          (&this_02->first,__n);
      uVar16 = (pvVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      pvVar15 = vector<unsigned_long,_true>::operator[](&this_03->first,__n);
      *pvVar15 = uVar16;
      if (uVar16 <= uVar21) {
        pvVar14 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                            (&this_02->first,__n);
        uVar16 = (pvVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
                 super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                 _M_head_impl;
        pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  ::operator->(this_00);
        if (((pWVar11->state).next_row_index <= uVar16) ||
           (uVar16 < (pWVar11->state).current_row_index)) {
          DataChunk::Reference(this_01,chunk);
          DataChunk::Slice(this_01,sel_vector,iVar18);
          pVVar10 = (ldastate->leaves).data.
                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.update)
                    (pVVar10,&local_48,
                     ((long)(ldastate->leaves).data.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 3) *
                     0x4ec4ec4ec4ec4ec5,pVVar1,iVar18);
          (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.combine)
                    (pVVar3,pVVar4,&local_48,iVar20);
          pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator->(this_00);
          if (((pWVar11->state).next_row_index <= uVar16) ||
             (uVar16 < (pWVar11->state).current_row_index)) {
            this_04 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                      ::operator->(&pWVar11->paged->inputs);
            ColumnDataCollection::Seek(this_04,uVar16,&pWVar11->state,&pWVar11->chunk);
          }
          iVar20 = 0;
          iVar18 = 0;
        }
        *(pointer *)(pdVar7 + iVar18 * 8) = puVar22;
        pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  ::operator->(this_00);
        sel_vector->sel_vector[iVar18] = (int)uVar16 - (int)(pWVar11->state).current_row_index;
        iVar18 = iVar18 + 1;
      }
      if (puVar23 != (pointer)0x0) {
        *(pointer *)(pdVar8 + iVar20 * 8) = puVar23;
        *(pointer *)(pdVar9 + iVar20 * 8) = puVar22;
        iVar20 = iVar20 + 1;
      }
      uVar16 = iVar18;
      if (iVar18 < iVar20) {
        uVar16 = iVar20;
      }
      if (0x7ff < uVar16) {
        DataChunk::Reference(this_01,chunk);
        DataChunk::Slice(this_01,sel_vector,iVar18);
        pVVar10 = (ldastate->leaves).data.
                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.update)
                  (pVVar10,&local_48,
                   ((long)(ldastate->leaves).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 3) *
                   0x4ec4ec4ec4ec4ec5,pVVar1,iVar18);
        (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.combine)
                  (pVVar3,pVVar4,&local_48,iVar20);
        iVar20 = 0;
        iVar18 = 0;
      }
      __n = __n + 1;
      puVar23 = puVar22;
    } while (__n < uVar13);
  }
  else {
    iVar20 = 0;
    iVar18 = 0;
  }
  if (iVar20 != 0 || iVar18 != 0) {
    DataChunk::Reference(this_01,chunk);
    DataChunk::Slice(this_01,sel_vector,iVar18);
    pVVar10 = (ldastate->leaves).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.update)
              (pVVar10,&local_48,
               ((long)(ldastate->leaves).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pVVar10 >> 3) * 0x4ec4ec4ec4ec4ec5,
               pVVar1,iVar18);
    (*(pWVar5->super_WindowAggregatorGlobalState).aggr.function.combine)
              (pVVar3,pVVar4,&local_48,iVar20);
  }
  LOCK();
  paVar2 = &(this->
            super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>)
            .build_complete;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void WindowDistinctSortTree::BuildRun(idx_t level_nr, idx_t run_idx, WindowDistinctAggregatorLocalState &ldastate) {
	auto &aggr = gdastate.aggr;
	auto &allocator = gdastate.allocator;
	auto &inputs = ldastate.cursor->chunk;
	auto &levels_flat_native = gdastate.levels_flat_native;

	//! Input data chunk, used for leaf segment aggregation
	auto &leaves = ldastate.leaves;
	auto &sel = ldastate.sel;

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);

	//! The states to update
	auto &update_v = ldastate.update_v;
	auto updates = FlatVector::GetData<data_ptr_t>(update_v);

	auto &source_v = ldastate.source_v;
	auto sources = FlatVector::GetData<data_ptr_t>(source_v);
	auto &target_v = ldastate.target_v;
	auto targets = FlatVector::GetData<data_ptr_t>(target_v);

	auto &zipped_tree = gdastate.zipped_tree;
	auto &zipped_level = zipped_tree.tree[level_nr].first;
	auto &level = tree[level_nr].first;

	//	Reset the combine state
	idx_t nupdate = 0;
	idx_t ncombine = 0;
	data_ptr_t prev_state = nullptr;
	idx_t i = run_idx * build_run_length;
	auto next_limit = MinValue<idx_t>(zipped_level.size(), i + build_run_length);
	idx_t levels_flat_offset = level_nr * zipped_level.size() + i;
	for (auto j = i; j < next_limit; ++j) {
		//	Initialise the next aggregate
		auto curr_state = levels_flat_native.GetStatePtr(levels_flat_offset++);

		//	Update this state (if it matches)
		const auto prev_idx = std::get<0>(zipped_level[j]);
		level[j] = prev_idx;
		if (prev_idx < i + 1) {
			const auto update_idx = std::get<1>(zipped_level[j]);
			if (!ldastate.cursor->RowIsVisible(update_idx)) {
				// 	Flush if we have to move the cursor
				//	Push the updates first so they propagate
				leaves.Reference(inputs);
				leaves.Slice(sel, nupdate);
				aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
				nupdate = 0;

				//	Combine the states sequentially
				aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
				ncombine = 0;

				// Move the update into range.
				ldastate.cursor->Seek(update_idx);
			}

			updates[nupdate] = curr_state;
			//	input_idx
			sel[nupdate] = ldastate.cursor->RowOffset(update_idx);
			++nupdate;
		}

		//	Merge the previous state (if any)
		if (prev_state) {
			sources[ncombine] = prev_state;
			targets[ncombine] = curr_state;
			++ncombine;
		}
		prev_state = curr_state;

		//	Flush the states if one is maxed out.
		if (MaxValue<idx_t>(ncombine, nupdate) >= STANDARD_VECTOR_SIZE) {
			//	Push the updates first so they propagate
			leaves.Reference(inputs);
			leaves.Slice(sel, nupdate);
			aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
			nupdate = 0;

			//	Combine the states sequentially
			aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
			ncombine = 0;
		}
	}

	//	Flush any remaining states
	if (ncombine || nupdate) {
		//	Push  the updates
		leaves.Reference(inputs);
		leaves.Slice(sel, nupdate);
		aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
		nupdate = 0;

		//	Combine the states sequentially
		aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
		ncombine = 0;
	}

	++build_complete;
}